

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>::iterator,_bool>
* __thiscall
phmap::priv::
parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<unsigned_int,unsigned_int>,phmap::Hash<unsigned_int>,phmap::EqualTo<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
::
emplace_decomposable_with_hash<unsigned_int,std::piecewise_construct_t_const&,std::tuple<unsigned_int_const&>,std::tuple<unsigned_int_const&>>
          (pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<unsigned_int,unsigned_int>,phmap::Hash<unsigned_int>,phmap::EqualTo<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
          *this,uint *key,size_t hashval,piecewise_construct_t *args,
          tuple<const_unsigned_int_&> *args_1,tuple<const_unsigned_int_&> *args_2)

{
  uint *puVar1;
  slot_type *psVar2;
  size_t sVar3;
  size_t i;
  ctrl_t *pcVar4;
  ctrl_t *pcVar5;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  *this_00;
  bool bVar6;
  
  this_00 = (raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             *)(this + (ulong)(((uint)(hashval >> 0x18) & 0xff ^
                               (uint)hashval >> 0x10 ^ (uint)(hashval >> 8) & 0xffffff) & 0xf) *
                       0x30);
  i = raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
      ::_find_key<unsigned_int>(this_00,key,hashval);
  bVar6 = i == 0xffffffffffffffff;
  if (bVar6) {
    i = raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
        ::prepare_insert(this_00,hashval);
    psVar2 = this_00->slots_;
    puVar1 = (args_2->super__Tuple_impl<0UL,_const_unsigned_int_&>).
             super__Head_base<0UL,_const_unsigned_int_&,_false>._M_head_impl;
    psVar2[i].value.first =
         *(args_1->super__Tuple_impl<0UL,_const_unsigned_int_&>).
          super__Head_base<0UL,_const_unsigned_int_&,_false>._M_head_impl;
    *(uint *)((long)psVar2 + i * 8 + 4) = *puVar1;
    raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned_int,_unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
    ::set_ctrl(this_00,i,(byte)hashval & 0x7f);
    pcVar4 = this_00->ctrl_;
    pcVar5 = pcVar4 + i;
  }
  else {
    pcVar4 = this_00->ctrl_;
    pcVar5 = pcVar4 + i;
  }
  psVar2 = this_00->slots_;
  sVar3 = this_00->capacity_;
  (__return_storage_ptr__->first).inner_ = (Inner *)this_00;
  (__return_storage_ptr__->first).inner_end_ = (Inner *)(this + 0x300);
  (__return_storage_ptr__->first).it_.ctrl_ = pcVar5;
  (__return_storage_ptr__->first).it_.field_1.slot_ = psVar2 + i;
  (__return_storage_ptr__->first).it_end_.ctrl_ = pcVar4 + sVar3;
  __return_storage_ptr__->second = bVar6;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> emplace_decomposable_with_hash(const K& key, size_t hashval, Args&&... args)
    {
        Inner& inner   = sets_[subidx(hashval)];
        auto&  set     = inner.set_;
        UniqueLock m(inner);
        
        size_t offset = set._find_key(key, hashval);
        if (offset == (size_t)-1) {
            offset = set.prepare_insert(hashval);
            set.emplace_at(offset, std::forward<Args>(args)...);
            set.set_ctrl(offset, H2(hashval));
            return make_rv(&inner, {set.iterator_at(offset), true});
        }
        return make_rv(&inner, {set.iterator_at(offset), false});
    }